

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O2

bool __thiscall
S2BooleanOperation::Impl::AddBoundaryPair
          (Impl *this,bool invert_a,bool invert_b,bool invert_result,CrossingProcessor *cp)

{
  bool bVar1;
  vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_> b_starts;
  vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_> a_starts;
  
  if (((this->op_->op_type_ & ~INTERSECTION) == DIFFERENCE) &&
     (bVar1 = AreRegionsIdentical(this), bVar1)) {
    return true;
  }
  a_starts.super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  a_starts.super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  a_starts.super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  b_starts.super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  b_starts.super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  b_starts.super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = GetChainStarts(this,0,invert_a,invert_b,invert_result,cp,&a_starts);
  if ((((bVar1) &&
       (bVar1 = GetChainStarts(this,1,invert_b,invert_a,invert_result,cp,&b_starts), bVar1)) &&
      (bVar1 = AddBoundary(this,0,invert_a,invert_b,invert_result,&a_starts,cp), bVar1)) &&
     (bVar1 = AddBoundary(this,1,invert_b,invert_a,invert_result,&b_starts,cp), bVar1)) {
    bVar1 = true;
    if (this->op_->result_empty_ == (bool *)0x0) {
      CrossingProcessor::DoneBoundaryPair(cp);
    }
  }
  else {
    bVar1 = false;
  }
  std::_Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>::
  ~_Vector_base(&b_starts.
                 super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>
               );
  std::_Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>::
  ~_Vector_base(&a_starts.
                 super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>
               );
  return bVar1;
}

Assistant:

bool S2BooleanOperation::Impl::AddBoundaryPair(
    bool invert_a, bool invert_b, bool invert_result, CrossingProcessor* cp) {
  // Optimization: if the operation is DIFFERENCE or SYMMETRIC_DIFFERENCE,
  // it is worthwhile checking whether the two regions are identical (in which
  // case the output is empty).
  //
  // TODO(ericv): When boolean output is requested there are other quick
  // checks that could be done here, such as checking whether a full cell from
  // one S2ShapeIndex intersects a non-empty cell of the other S2ShapeIndex.
  auto type = op_->op_type();
  if (type == OpType::DIFFERENCE || type == OpType::SYMMETRIC_DIFFERENCE) {
    if (AreRegionsIdentical()) return true;
  } else if (!is_boolean_output()) {
  }
  vector<ShapeEdgeId> a_starts, b_starts;
  if (!GetChainStarts(0, invert_a, invert_b, invert_result, cp, &a_starts) ||
      !GetChainStarts(1, invert_b, invert_a, invert_result, cp, &b_starts) ||
      !AddBoundary(0, invert_a, invert_b, invert_result, a_starts, cp) ||
      !AddBoundary(1, invert_b, invert_a, invert_result, b_starts, cp)) {
    return false;
  }
  if (!is_boolean_output()) cp->DoneBoundaryPair();
  return true;
}